

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O2

Type * __thiscall
spvtools::opt::ConvertToSampledImagePass::GetVariableType
          (ConvertToSampledImagePass *this,Instruction *variable)

{
  uint32_t id;
  int iVar1;
  TypeManager *this_00;
  Type *pTVar2;
  undefined4 extraout_var;
  
  if (variable->opcode_ == OpVariable) {
    this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
    id = Instruction::type_id(variable);
    pTVar2 = analysis::TypeManager::GetType(this_00,id);
    iVar1 = (*pTVar2->_vptr_Type[0x1f])(pTVar2);
    if (CONCAT44(extraout_var,iVar1) == 0) {
      pTVar2 = (Type *)0x0;
    }
    else {
      pTVar2 = *(Type **)(CONCAT44(extraout_var,iVar1) + 0x28);
    }
    return pTVar2;
  }
  return (Type *)0x0;
}

Assistant:

const analysis::Type* ConvertToSampledImagePass::GetVariableType(
    const Instruction& variable) const {
  if (variable.opcode() != spv::Op::OpVariable) return nullptr;
  auto* type = context()->get_type_mgr()->GetType(variable.type_id());
  auto* pointer_type = type->AsPointer();
  if (!pointer_type) return nullptr;

  return pointer_type->pointee_type();
}